

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_unitsInModel_Test::Clone_unitsInModel_Test(Clone_unitsInModel_Test *this)

{
  Clone_unitsInModel_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Clone_unitsInModel_Test_00124e28;
  return;
}

Assistant:

TEST(Clone, unitsInModel)
{
    auto m = libcellml::Model::create();
    auto u = libcellml::Units::create();

    u->setId("unique_id");
    u->setName("units");

    m->addUnits(u);

    auto uClone = u->clone();

    compareUnits(u, uClone);
}